

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_compress.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  DIR *pDVar3;
  dirent *pdVar4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  void *pvVar9;
  void *pvVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  img_fol_t img_fol;
  char image_filename [4096];
  opj_cparameters_t parameters;
  char outfilename [4096];
  char infilename [4096];
  char temp_ofname [4096];
  char indexfilename [4096];
  size_t in_stack_ffffffffffff5638;
  opj_image_t *local_a9c0;
  long *local_a9b8;
  long local_a9a0;
  img_fol_t local_a998;
  double local_a980;
  raw_cparameters_t local_a978;
  rusage local_a958 [28];
  opj_cparameters_t local_9958;
  char local_5038;
  char acStack_5037 [4095];
  char local_4038;
  char acStack_4037 [4095];
  char local_3038 [4096];
  char local_2038 [4096];
  char local_1038 [4104];
  
  local_a9b8 = (long *)0x0;
  getrusage(RUSAGE_SELF,(rusage *)&local_9958);
  opj_set_default_encoder_parameters(&local_9958);
  local_2038[0] = '\0';
  local_a998.imgdirpath = (char *)0x0;
  local_a998.out_format = (char *)0x0;
  local_a998.set_imgdir = '\0';
  local_a998.set_out_format = '\0';
  local_a998._18_6_ = 0;
  local_a978.rawComps = (raw_comp_cparameters_t *)0x0;
  local_a978.rawWidth = 0;
  local_a978.rawHeight = 0;
  local_a978.rawComp = 0;
  local_a978.rawBitDepth = 0;
  local_a978.rawSigned = 0;
  local_9958.tcp_mct = -1;
  iVar2 = parse_cmdline_encoder
                    (argc,argv,&local_9958,&local_a998,&local_a978,local_2038,
                     in_stack_ffffffffffff5638);
  pcVar1 = local_a998.imgdirpath;
  iVar13 = 1;
  if (iVar2 == 1) goto LAB_00106960;
  if (local_a998.set_imgdir == '\x01') {
    pDVar3 = opendir(local_a998.imgdirpath);
    if (pDVar3 == (DIR *)0x0) {
      uVar12 = 0;
      fprintf(_stderr,"Could not open Folder %s\n",pcVar1);
    }
    else {
      pdVar4 = readdir(pDVar3);
      if (pdVar4 == (dirent *)0x0) {
        uVar12 = 0;
      }
      else {
        uVar12 = 0;
        do {
          iVar2 = strcmp(".",pdVar4->d_name);
          if ((iVar2 != 0) && (iVar2 = strcmp("..",pdVar4->d_name), iVar2 != 0)) {
            uVar12 = uVar12 + 1;
          }
          pdVar4 = readdir(pDVar3);
        } while (pdVar4 != (dirent *)0x0);
      }
      closedir(pDVar3);
    }
    local_a9b8 = (long *)malloc(0x10);
    if (local_a9b8 != (long *)0x0) {
      pvVar9 = malloc((ulong)(uVar12 << 0xc));
      *local_a9b8 = (long)pvVar9;
      pvVar10 = malloc((ulong)uVar12 * 8);
      local_a9b8[1] = (long)pvVar10;
      iVar13 = 0;
      if (pvVar9 == (void *)0x0) goto LAB_00106960;
      if (uVar12 != 0) {
        uVar11 = 0;
        do {
          *(ulong *)(local_a9b8[1] + uVar11 * 8) = (ulong)(uint)((int)uVar11 << 0xc) + *local_a9b8;
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar12);
      }
    }
    pDVar3 = opendir(pcVar1);
    if (pDVar3 == (DIR *)0x0) {
      fprintf(_stderr,"Could not open Folder %s\n",pcVar1);
    }
    else {
      main_cold_1();
    }
    iVar13 = 0;
    if (pDVar3 == (DIR *)0x0) goto LAB_00106960;
    if (uVar12 == 0) {
      fwrite("Folder is empty\n",0x10,1,_stdout);
      goto LAB_00106960;
    }
  }
  else {
    uVar12 = 1;
    local_a9b8 = (long *)0x0;
  }
  local_a980 = (double)(long)(local_9958._24_8_ + local_9958._8_8_) * 1e-06 +
               (double)(long)(local_9958._16_8_ + local_9958._0_8_);
  uVar14 = 0;
  local_a9a0 = 0;
  do {
    fputc(10,_stderr);
    if (local_a998.set_imgdir != '\x01') goto LAB_00106248;
    memset(local_1038,0,0x1000);
    strcpy((char *)local_a958,*(char **)(local_a9b8[1] + (long)(int)uVar14 * 8));
    fprintf(_stderr,"File Number %d \"%s\"\n",(ulong)uVar14,local_a958);
    local_9958.decod_format = get_file_format((char *)local_a958);
    pcVar1 = local_a998.imgdirpath;
    if (local_9958.decod_format != -1) {
      sprintf(&local_4038,"%s/%s",local_a998.imgdirpath,local_a958);
      if (local_4038 == '\0') {
        uVar11 = 0;
      }
      else {
        uVar8 = 0;
        do {
          uVar11 = uVar8 + 1;
          if (acStack_4037[uVar8] == '\0') break;
          bVar15 = uVar8 < 0xfff;
          uVar8 = uVar11;
        } while (bVar15);
      }
      if (0xfff < uVar11) goto LAB_001066eb;
      memcpy(local_9958.infile,&local_4038,uVar11);
      local_9958.infile[uVar11] = '\0';
      pcVar7 = strtok((char *)local_a958,".");
      strcpy(local_3038,pcVar7);
      pcVar7 = strtok((char *)0x0,".");
      while (pcVar7 != (char *)0x0) {
        strcat(local_3038,local_1038);
        sprintf(local_1038,".%s",pcVar7);
        pcVar7 = strtok((char *)0x0,".");
      }
      if (local_a998.set_out_format == '\x01') {
        sprintf(&local_5038,"%s/%s.%s",pcVar1,local_3038,local_a998.out_format);
        if (local_5038 == '\0') {
          uVar11 = 0;
        }
        else {
          uVar8 = 0;
          do {
            uVar11 = uVar8 + 1;
            if (acStack_5037[uVar8] == '\0') break;
            bVar15 = uVar8 < 0xfff;
            uVar8 = uVar11;
          } while (bVar15);
        }
        if (0xfff < uVar11) goto LAB_001066eb;
        memcpy(local_9958.outfile,&local_5038,uVar11);
        local_9958.outfile[uVar11] = '\0';
      }
LAB_00106248:
      switch(local_9958.decod_format) {
      case 10:
        local_a9c0 = pnmtoimage(local_9958.infile,&local_9958);
        if (local_a9c0 == (opj_image_t *)0x0) {
          main_cold_8();
        }
        else {
LAB_0010637c:
          if (local_9958.tcp_mct == '\x01') {
            if (2 < local_a9c0->numcomps) goto LAB_001063b7;
            main_cold_9();
          }
          else {
            if (local_9958.tcp_mct == -1) {
              local_9958.tcp_mct = 2 < local_a9c0->numcomps;
            }
            else {
LAB_001063b7:
              if ((local_9958.tcp_mct == '\x02') && (local_9958.mct_data == (void *)0x0)) {
                main_cold_10();
                break;
              }
            }
            iVar2 = local_9958.cod_format;
            if (local_9958.cod_format != 0) {
              if (local_9958.cod_format != 1) {
                main_cold_15();
                goto LAB_001064fd;
              }
              iVar2 = 2;
            }
            uVar5 = opj_create_compress(iVar2);
            opj_set_info_handler(uVar5,info_callback,0);
            opj_set_warning_handler(uVar5,warning_callback,0);
            opj_set_error_handler(uVar5,error_callback,0);
            iVar2 = opj_setup_encoder(uVar5,&local_9958,local_a9c0);
            if (iVar2 != 0) {
              lVar6 = opj_stream_create_default_file_stream(local_9958.outfile,0);
              iVar13 = 1;
              if (lVar6 != 0) {
                iVar2 = opj_start_compress(uVar5,local_a9c0,lVar6);
                if (iVar2 == 0) {
                  main_cold_11();
LAB_001068ca:
                  main_cold_12();
                }
                else {
                  iVar2 = opj_encode(uVar5,lVar6);
                  if (iVar2 == 0) goto LAB_001068ca;
                  iVar2 = opj_end_compress(uVar5,lVar6);
                  if (iVar2 != 0) {
                    local_a9a0 = local_a9a0 + 1;
                    fprintf(_stdout,"[INFO] Generated outfile %s\n",local_9958.outfile);
                    opj_stream_destroy(lVar6);
                    opj_destroy_codec(uVar5);
                    opj_image_destroy();
                    goto LAB_001064fd;
                  }
                }
                main_cold_13();
                iVar13 = 1;
              }
              goto LAB_00106960;
            }
            main_cold_14();
          }
        }
        break;
      case 0xb:
        local_a9c0 = pgxtoimage(local_9958.infile,&local_9958);
        if (local_a9c0 != (opj_image_t *)0x0) goto LAB_0010637c;
        main_cold_16();
        break;
      case 0xc:
        local_a9c0 = bmptoimage(local_9958.infile,&local_9958);
        if (local_a9c0 != (opj_image_t *)0x0) goto LAB_0010637c;
        main_cold_7();
        break;
      default:
        main_cold_17();
        goto LAB_001064fd;
      case 0xe:
        local_a9c0 = tiftoimage(local_9958.infile,&local_9958);
        if (local_a9c0 != (opj_image_t *)0x0) goto LAB_0010637c;
        main_cold_6();
        break;
      case 0xf:
        local_a9c0 = rawtoimage(local_9958.infile,&local_9958,&local_a978);
        if (local_a9c0 != (opj_image_t *)0x0) goto LAB_0010637c;
        main_cold_5();
        break;
      case 0x10:
        local_a9c0 = tgatoimage(local_9958.infile,&local_9958);
        if (local_a9c0 != (opj_image_t *)0x0) goto LAB_0010637c;
        main_cold_3();
        break;
      case 0x11:
        local_a9c0 = pngtoimage(local_9958.infile,&local_9958);
        if (local_a9c0 != (opj_image_t *)0x0) goto LAB_0010637c;
        main_cold_2();
        break;
      case 0x12:
        local_a9c0 = rawltoimage(local_9958.infile,&local_9958,&local_a978);
        if (local_a9c0 != (opj_image_t *)0x0) goto LAB_0010637c;
        main_cold_4();
      }
      iVar13 = 1;
      goto LAB_00106960;
    }
LAB_001066eb:
    fwrite("skipping file...\n",0x11,1,_stderr);
LAB_001064fd:
    uVar14 = uVar14 + 1;
  } while (uVar14 != uVar12 + (uVar12 == 0));
  iVar13 = 0;
  getrusage(RUSAGE_SELF,local_a958);
  if (local_a9a0 != 0) {
    auVar16._8_4_ = (int)((ulong)local_a9a0 >> 0x20);
    auVar16._0_8_ = local_a9a0;
    auVar16._12_4_ = 0x45300000;
    iVar13 = 0;
    fprintf(_stdout,"encode time: %d ms \n",
            (ulong)(uint)(int)(((((double)(local_a958[0].ru_utime.tv_usec +
                                          local_a958[0].ru_stime.tv_usec) * 1e-06 +
                                 (double)(local_a958[0].ru_utime.tv_sec +
                                         local_a958[0].ru_stime.tv_sec)) - local_a980) * 1000.0) /
                              ((auVar16._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)local_a9a0) - 4503599627370496.0))))
    ;
  }
LAB_00106960:
  if (local_9958.cp_comment != (char *)0x0) {
    free(local_9958.cp_comment);
  }
  if (local_9958.cp_matrice != (int *)0x0) {
    free(local_9958.cp_matrice);
  }
  if (local_a978.rawComps != (raw_comp_cparameters_t *)0x0) {
    free(local_a978.rawComps);
  }
  if (local_a998.imgdirpath != (char *)0x0) {
    free(local_a998.imgdirpath);
  }
  if (local_a9b8 != (long *)0x0) {
    if ((void *)*local_a9b8 != (void *)0x0) {
      free((void *)*local_a9b8);
    }
    if ((void *)local_a9b8[1] != (void *)0x0) {
      free((void *)local_a9b8[1]);
    }
    free(local_a9b8);
  }
  return iVar13;
}

Assistant:

int main(int argc, char **argv)
{

    opj_cparameters_t parameters;   /* compression parameters */

    opj_stream_t *l_stream = 00;
    opj_codec_t* l_codec = 00;
    opj_image_t *image = NULL;
    raw_cparameters_t raw_cp;
    OPJ_SIZE_T num_compressed_files = 0;

    char indexfilename[OPJ_PATH_LEN];   /* index file name */

    unsigned int i, num_images, imageno;
    img_fol_t img_fol;
    dircnt_t *dirptr = NULL;

    int ret = 0;

    OPJ_BOOL bSuccess;
    OPJ_BOOL bUseTiles = OPJ_FALSE; /* OPJ_TRUE */
    OPJ_UINT32 l_nb_tiles = 4;
    OPJ_FLOAT64 t = opj_clock();

    /* set encoding parameters to default values */
    opj_set_default_encoder_parameters(&parameters);

    /* Initialize indexfilename and img_fol */
    *indexfilename = 0;
    memset(&img_fol, 0, sizeof(img_fol_t));

    /* raw_cp initialization */
    raw_cp.rawBitDepth = 0;
    raw_cp.rawComp = 0;
    raw_cp.rawComps = 0;
    raw_cp.rawHeight = 0;
    raw_cp.rawSigned = 0;
    raw_cp.rawWidth = 0;

    /* parse input and get user encoding parameters */
    parameters.tcp_mct = (char)
                         255; /* This will be set later according to the input image or the provided option */
    if (parse_cmdline_encoder(argc, argv, &parameters, &img_fol, &raw_cp,
                              indexfilename, sizeof(indexfilename)) == 1) {
        ret = 1;
        goto fin;
    }

    /* Read directory if necessary */
    if (img_fol.set_imgdir == 1) {
        num_images = get_num_images(img_fol.imgdirpath);
        dirptr = (dircnt_t*)malloc(sizeof(dircnt_t));
        if (dirptr) {
            dirptr->filename_buf = (char*)malloc(num_images * OPJ_PATH_LEN * sizeof(
                    char)); /* Stores at max 10 image file names*/
            dirptr->filename = (char**) malloc(num_images * sizeof(char*));
            if (!dirptr->filename_buf) {
                ret = 0;
                goto fin;
            }
            for (i = 0; i < num_images; i++) {
                dirptr->filename[i] = dirptr->filename_buf + i * OPJ_PATH_LEN;
            }
        }
        if (load_images(dirptr, img_fol.imgdirpath) == 1) {
            ret = 0;
            goto fin;
        }
        if (num_images == 0) {
            fprintf(stdout, "Folder is empty\n");
            ret = 0;
            goto fin;
        }
    } else {
        num_images = 1;
    }
    /*Encoding image one by one*/
    for (imageno = 0; imageno < num_images; imageno++) {
        image = NULL;
        fprintf(stderr, "\n");

        if (img_fol.set_imgdir == 1) {
            if (get_next_file((int)imageno, dirptr, &img_fol, &parameters)) {
                fprintf(stderr, "skipping file...\n");
                continue;
            }
        }

        switch (parameters.decod_format) {
        case PGX_DFMT:
            break;
        case PXM_DFMT:
            break;
        case BMP_DFMT:
            break;
        case TIF_DFMT:
            break;
        case RAW_DFMT:
        case RAWL_DFMT:
            break;
        case TGA_DFMT:
            break;
        case PNG_DFMT:
            break;
        default:
            fprintf(stderr, "skipping file...\n");
            continue;
        }

        /* decode the source image */
        /* ----------------------- */

        switch (parameters.decod_format) {
        case PGX_DFMT:
            image = pgxtoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load pgx file\n");
                ret = 1;
                goto fin;
            }
            break;

        case PXM_DFMT:
            image = pnmtoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load pnm file\n");
                ret = 1;
                goto fin;
            }
            break;

        case BMP_DFMT:
            image = bmptoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load bmp file\n");
                ret = 1;
                goto fin;
            }
            break;

#ifdef OPJ_HAVE_LIBTIFF
        case TIF_DFMT:
            image = tiftoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load tiff file\n");
                ret = 1;
                goto fin;
            }
            break;
#endif /* OPJ_HAVE_LIBTIFF */

        case RAW_DFMT:
            image = rawtoimage(parameters.infile, &parameters, &raw_cp);
            if (!image) {
                fprintf(stderr, "Unable to load raw file\n");
                ret = 1;
                goto fin;
            }
            break;

        case RAWL_DFMT:
            image = rawltoimage(parameters.infile, &parameters, &raw_cp);
            if (!image) {
                fprintf(stderr, "Unable to load raw file\n");
                ret = 1;
                goto fin;
            }
            break;

        case TGA_DFMT:
            image = tgatoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load tga file\n");
                ret = 1;
                goto fin;
            }
            break;

#ifdef OPJ_HAVE_LIBPNG
        case PNG_DFMT:
            image = pngtoimage(parameters.infile, &parameters);
            if (!image) {
                fprintf(stderr, "Unable to load png file\n");
                ret = 1;
                goto fin;
            }
            break;
#endif /* OPJ_HAVE_LIBPNG */
        }

        /* Can happen if input file is TIFF or PNG
        * and OPJ_HAVE_LIBTIF or OPJ_HAVE_LIBPNG is undefined
        */
        if (!image) {
            fprintf(stderr, "Unable to load file: got no image\n");
            ret = 1;
            goto fin;
        }

        /* Decide if MCT should be used */
        if (parameters.tcp_mct == (char)
                255) { /* mct mode has not been set in commandline */
            parameters.tcp_mct = (image->numcomps >= 3) ? 1 : 0;
        } else {            /* mct mode has been set in commandline */
            if ((parameters.tcp_mct == 1) && (image->numcomps < 3)) {
                fprintf(stderr, "RGB->YCC conversion cannot be used:\n");
                fprintf(stderr, "Input image has less than 3 components\n");
                ret = 1;
                goto fin;
            }
            if ((parameters.tcp_mct == 2) && (!parameters.mct_data)) {
                fprintf(stderr, "Custom MCT has been set but no array-based MCT\n");
                fprintf(stderr, "has been provided. Aborting.\n");
                ret = 1;
                goto fin;
            }
        }

        /* encode the destination image */
        /* ---------------------------- */

        switch (parameters.cod_format) {
        case J2K_CFMT: { /* JPEG-2000 codestream */
            /* Get a decoder handle */
            l_codec = opj_create_compress(OPJ_CODEC_J2K);
            break;
        }
        case JP2_CFMT: { /* JPEG 2000 compressed image data */
            /* Get a decoder handle */
            l_codec = opj_create_compress(OPJ_CODEC_JP2);
            break;
        }
        default:
            fprintf(stderr, "skipping file..\n");
            opj_stream_destroy(l_stream);
            continue;
        }

        /* catch events using our callbacks and give a local context */
        opj_set_info_handler(l_codec, info_callback, 00);
        opj_set_warning_handler(l_codec, warning_callback, 00);
        opj_set_error_handler(l_codec, error_callback, 00);

        if (bUseTiles) {
            parameters.cp_tx0 = 0;
            parameters.cp_ty0 = 0;
            parameters.tile_size_on = OPJ_TRUE;
            parameters.cp_tdx = 512;
            parameters.cp_tdy = 512;
        }
        if (! opj_setup_encoder(l_codec, &parameters, image)) {
            fprintf(stderr, "failed to encode image: opj_setup_encoder\n");
            opj_destroy_codec(l_codec);
            opj_image_destroy(image);
            ret = 1;
            goto fin;
        }

        /* open a byte stream for writing and allocate memory for all tiles */
        l_stream = opj_stream_create_default_file_stream(parameters.outfile, OPJ_FALSE);
        if (! l_stream) {
            ret = 1;
            goto fin;
        }

        /* encode the image */
        bSuccess = opj_start_compress(l_codec, image, l_stream);
        if (!bSuccess)  {
            fprintf(stderr, "failed to encode image: opj_start_compress\n");
        }
        if (bSuccess && bUseTiles) {
            OPJ_BYTE *l_data;
            OPJ_UINT32 l_data_size = 512 * 512 * 3;
            l_data = (OPJ_BYTE*) calloc(1, l_data_size);
            if (l_data == NULL) {
                ret = 1;
                goto fin;
            }
            for (i = 0; i < l_nb_tiles; ++i) {
                if (! opj_write_tile(l_codec, i, l_data, l_data_size, l_stream)) {
                    fprintf(stderr, "ERROR -> test_tile_encoder: failed to write the tile %d!\n",
                            i);
                    opj_stream_destroy(l_stream);
                    opj_destroy_codec(l_codec);
                    opj_image_destroy(image);
                    ret = 1;
                    goto fin;
                }
            }
            free(l_data);
        } else {
            bSuccess = bSuccess && opj_encode(l_codec, l_stream);
            if (!bSuccess)  {
                fprintf(stderr, "failed to encode image: opj_encode\n");
            }
        }
        bSuccess = bSuccess && opj_end_compress(l_codec, l_stream);
        if (!bSuccess)  {
            fprintf(stderr, "failed to encode image: opj_end_compress\n");
        }

        if (!bSuccess)  {
            opj_stream_destroy(l_stream);
            opj_destroy_codec(l_codec);
            opj_image_destroy(image);
            fprintf(stderr, "failed to encode image\n");
            remove(parameters.outfile);
            ret = 1;
            goto fin;
        }

        num_compressed_files++;
        fprintf(stdout, "[INFO] Generated outfile %s\n", parameters.outfile);
        /* close and free the byte stream */
        opj_stream_destroy(l_stream);

        /* free remaining compression structures */
        opj_destroy_codec(l_codec);

        /* free image data */
        opj_image_destroy(image);

    }

    t = opj_clock() - t;
    if (num_compressed_files) {
        fprintf(stdout, "encode time: %d ms \n",
                (int)((t * 1000.0) / (OPJ_FLOAT64)num_compressed_files));
    }

    ret = 0;

fin:
    if (parameters.cp_comment) {
        free(parameters.cp_comment);
    }
    if (parameters.cp_matrice) {
        free(parameters.cp_matrice);
    }
    if (raw_cp.rawComps) {
        free(raw_cp.rawComps);
    }
    if (img_fol.imgdirpath) {
        free(img_fol.imgdirpath);
    }
    if (dirptr) {
        if (dirptr->filename_buf) {
            free(dirptr->filename_buf);
        }
        if (dirptr->filename) {
            free(dirptr->filename);
        }
        free(dirptr);
    }
    return ret;
}